

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O0

void icu_63::Normalizer2DataBuilder::computeDiff
               (Normalizer2DataBuilder *b1,Normalizer2DataBuilder *b2,Normalizer2DataBuilder *diff)

{
  UBool UVar1;
  uint8_t cc;
  uint8_t uVar2;
  int iVar3;
  UChar32 UVar4;
  Norm *this;
  Norm *this_00;
  bool bVar5;
  MappingType local_19c;
  UnicodeString *pUStack_198;
  MappingType type2;
  UnicodeString *mapping2;
  UnicodeString *pUStack_188;
  MappingType type1;
  UnicodeString *mapping1;
  Norm *norm2;
  Norm *norm1;
  undefined1 local_168 [4];
  UChar32 c_1;
  UnicodeSetIterator mIter;
  UnicodeSet mSet;
  undefined1 local_c8 [2];
  uint8_t cc2;
  uint8_t cc1;
  UChar32 c;
  UnicodeSetIterator ccIter;
  undefined1 local_78 [8];
  UnicodeSet ccSet;
  Normalizer2DataBuilder *diff_local;
  Normalizer2DataBuilder *b2_local;
  Normalizer2DataBuilder *b1_local;
  
  ccSet._80_8_ = diff;
  iVar3 = memcmp(b1->unicodeVersion,b2->unicodeVersion,4);
  if (iVar3 != 0) {
    *(undefined4 *)(ccSet._80_8_ + 0x278) = *(undefined4 *)b1->unicodeVersion;
  }
  UnicodeSet::UnicodeSet((UnicodeSet *)local_78,(UnicodeSet *)b1);
  UnicodeSet::addAll((UnicodeSet *)local_78,(UnicodeSet *)b2);
  UnicodeSetIterator::UnicodeSetIterator((UnicodeSetIterator *)local_c8,(UnicodeSet *)local_78);
  while( true ) {
    UVar1 = UnicodeSetIterator::next((UnicodeSetIterator *)local_c8);
    bVar5 = false;
    if (UVar1 != '\0') {
      UVar1 = UnicodeSetIterator::isString((UnicodeSetIterator *)local_c8);
      bVar5 = UVar1 == '\0';
    }
    if (!bVar5) break;
    UVar4 = UnicodeSetIterator::getCodepoint((UnicodeSetIterator *)local_c8);
    cc = Norms::getCC(&b1->norms,UVar4);
    uVar2 = Norms::getCC(&b2->norms,UVar4);
    if (cc != uVar2) {
      setCC((Normalizer2DataBuilder *)ccSet._80_8_,UVar4,cc);
    }
  }
  UnicodeSet::UnicodeSet((UnicodeSet *)&mIter.cpString,&(b1->norms).mappingSet);
  UnicodeSet::addAll((UnicodeSet *)&mIter.cpString,&(b2->norms).mappingSet);
  UnicodeSetIterator::UnicodeSetIterator
            ((UnicodeSetIterator *)local_168,(UnicodeSet *)&mIter.cpString);
  while( true ) {
    UVar1 = UnicodeSetIterator::next((UnicodeSetIterator *)local_168);
    bVar5 = false;
    if (UVar1 != '\0') {
      UVar1 = UnicodeSetIterator::isString((UnicodeSetIterator *)local_168);
      bVar5 = UVar1 == '\0';
    }
    if (!bVar5) break;
    UVar4 = UnicodeSetIterator::getCodepoint((UnicodeSetIterator *)local_168);
    this = Norms::getNorm(&b1->norms,UVar4);
    this_00 = Norms::getNorm(&b2->norms,UVar4);
    if ((this == (Norm *)0x0) || (UVar1 = Norm::hasMapping(this), UVar1 == '\0')) {
      pUStack_188 = (UnicodeString *)0x0;
      mapping2._4_4_ = NONE;
    }
    else {
      pUStack_188 = this->mapping;
      mapping2._4_4_ = this->mappingType;
    }
    if ((this_00 == (Norm *)0x0) || (UVar1 = Norm::hasMapping(this_00), UVar1 == '\0')) {
      pUStack_198 = (UnicodeString *)0x0;
      local_19c = NONE;
    }
    else {
      pUStack_198 = this_00->mapping;
      local_19c = this_00->mappingType;
    }
    if ((mapping2._4_4_ != local_19c) ||
       (bVar5 = anon_unknown_1::equalStrings(pUStack_188,pUStack_198), !bVar5)) {
      if (mapping2._4_4_ == NONE) {
        removeMapping((Normalizer2DataBuilder *)ccSet._80_8_,UVar4);
      }
      else if (mapping2._4_4_ == ROUND_TRIP) {
        setRoundTripMapping((Normalizer2DataBuilder *)ccSet._80_8_,UVar4,pUStack_188);
      }
      else if (mapping2._4_4_ == ONE_WAY) {
        setOneWayMapping((Normalizer2DataBuilder *)ccSet._80_8_,UVar4,pUStack_188);
      }
    }
  }
  UnicodeSetIterator::~UnicodeSetIterator((UnicodeSetIterator *)local_168);
  UnicodeSet::~UnicodeSet((UnicodeSet *)&mIter.cpString);
  UnicodeSetIterator::~UnicodeSetIterator((UnicodeSetIterator *)local_c8);
  UnicodeSet::~UnicodeSet((UnicodeSet *)local_78);
  return;
}

Assistant:

void
Normalizer2DataBuilder::computeDiff(const Normalizer2DataBuilder &b1,
                                    const Normalizer2DataBuilder &b2,
                                    Normalizer2DataBuilder &diff) {
    // Compute diff = b1 - b2
    // so that we should be able to get b1 = b2 + diff.
    if(0 != memcmp(b1.unicodeVersion, b2.unicodeVersion, U_MAX_VERSION_LENGTH)) {
        memcpy(diff.unicodeVersion, b1.unicodeVersion, U_MAX_VERSION_LENGTH);
    }

    UnicodeSet ccSet(b1.norms.ccSet);
    ccSet.addAll(b2.norms.ccSet);
    UnicodeSetIterator ccIter(ccSet);
    while(ccIter.next() && !ccIter.isString()) {
        UChar32 c = ccIter.getCodepoint();
        uint8_t cc1 = b1.norms.getCC(c);
        uint8_t cc2 = b2.norms.getCC(c);
        if(cc1 != cc2) {
            diff.setCC(c, cc1);
        }
    }

    UnicodeSet mSet(b1.norms.mappingSet);
    mSet.addAll(b2.norms.mappingSet);
    UnicodeSetIterator mIter(mSet);
    while(mIter.next() && !mIter.isString()) {
        UChar32 c = mIter.getCodepoint();
        const Norm *norm1 = b1.norms.getNorm(c);
        const Norm *norm2 = b2.norms.getNorm(c);
        const UnicodeString *mapping1;
        Norm::MappingType type1;
        if(norm1 == nullptr || !norm1->hasMapping()) {
            mapping1 = nullptr;
            type1 = Norm::NONE;
        } else {
            mapping1 = norm1->mapping;
            type1 = norm1->mappingType;
        }
        const UnicodeString *mapping2;
        Norm::MappingType type2;
        if(norm2 == nullptr || !norm2->hasMapping()) {
            mapping2 = nullptr;
            type2 = Norm::NONE;
        } else {
            mapping2 = norm2->mapping;
            type2 = norm2->mappingType;
        }
        if(type1 == type2 && equalStrings(mapping1, mapping2)) {
            // Nothing to do.
        } else if(type1 == Norm::NONE) {
            diff.removeMapping(c);
        } else if(type1 == Norm::ROUND_TRIP) {
            diff.setRoundTripMapping(c, *mapping1);
        } else if(type1 == Norm::ONE_WAY) {
            diff.setOneWayMapping(c, *mapping1);
        }
    }
}